

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O3

void iidentity4_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  longlong lVar9;
  longlong lVar10;
  longlong lVar11;
  longlong lVar12;
  longlong lVar13;
  longlong lVar14;
  longlong lVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  undefined1 in_XMM0 [16];
  undefined1 auVar19 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  __m128i clamp_hi;
  __m128i clamp_lo;
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  int local_18;
  int iStack_14;
  int iStack_10;
  int iStack_c;
  
  lVar17 = 0;
  auVar19 = pmovsxwq(in_XMM0,0x16a116a1);
  auVar20 = pmovsxwq(in_XMM1,0x8000800);
  do {
    auVar21 = *(undefined1 (*) [16])((long)*in + lVar17);
    auVar23._4_4_ = auVar21._4_4_;
    auVar23._0_4_ = auVar21._4_4_;
    auVar23._8_4_ = auVar21._12_4_;
    auVar23._12_4_ = auVar21._12_4_;
    auVar21 = pmuldq(auVar21,auVar19);
    auVar22._0_8_ = CONCAT44(auVar21._4_4_ + auVar20._4_4_,auVar21._0_4_ + auVar20._0_4_);
    auVar22._8_4_ = auVar21._8_4_ + auVar20._8_4_;
    auVar22._12_4_ = auVar21._12_4_ + auVar20._12_4_;
    auVar21 = pmuldq(auVar23,auVar19);
    auVar24._0_8_ = CONCAT44(auVar21._4_4_ + auVar20._4_4_,auVar21._0_4_ + auVar20._0_4_);
    auVar24._8_4_ = auVar21._8_4_ + auVar20._8_4_;
    auVar24._12_4_ = auVar21._12_4_ + auVar20._12_4_;
    puVar1 = (undefined8 *)((long)*out + lVar17);
    *puVar1 = CONCAT44((int)(auVar24._0_8_ >> 0xc),(int)(auVar22._0_8_ >> 0xc));
    puVar1[1] = CONCAT44((int)(auVar24._8_8_ >> 0xc),(int)(auVar22._8_8_ >> 0xc));
    lVar17 = lVar17 + 0x10;
  } while (lVar17 != 0x40);
  if (do_cols != 0) {
    return;
  }
  iVar18 = 10;
  if (10 < bd) {
    iVar18 = bd;
  }
  local_28 = 0x20 << ((byte)iVar18 & 0x1f);
  local_18 = -local_28;
  local_28 = local_28 + -1;
  if (out_shift != 0) {
    iVar16 = 1 << ((char)out_shift - 1U & 0x1f);
    iVar18 = *(int *)((long)*out + 4);
    lVar9 = (*out)[1];
    iVar2 = *(int *)((long)*out + 0xc);
    lVar10 = out[1][0];
    iVar3 = *(int *)((long)out[1] + 4);
    lVar11 = out[1][1];
    iVar4 = *(int *)((long)out[1] + 0xc);
    lVar12 = out[2][0];
    iVar5 = *(int *)((long)out[2] + 4);
    lVar13 = out[2][1];
    iVar6 = *(int *)((long)out[2] + 0xc);
    lVar14 = out[3][0];
    iVar7 = *(int *)((long)out[3] + 4);
    lVar15 = out[3][1];
    iVar8 = *(int *)((long)out[3] + 0xc);
    auVar19 = ZEXT416((uint)out_shift);
    *(int *)*out = (int)(*out)[0] + iVar16 >> auVar19;
    *(int *)((long)*out + 4) = iVar18 + iVar16 >> auVar19;
    *(int *)(*out + 1) = (int)lVar9 + iVar16 >> auVar19;
    *(int *)((long)*out + 0xc) = iVar2 + iVar16 >> auVar19;
    *(int *)out[1] = (int)lVar10 + iVar16 >> auVar19;
    *(int *)((long)out[1] + 4) = iVar3 + iVar16 >> auVar19;
    *(int *)(out[1] + 1) = (int)lVar11 + iVar16 >> auVar19;
    *(int *)((long)out[1] + 0xc) = iVar4 + iVar16 >> auVar19;
    *(int *)out[2] = (int)lVar12 + iVar16 >> auVar19;
    *(int *)((long)out[2] + 4) = iVar5 + iVar16 >> auVar19;
    *(int *)(out[2] + 1) = (int)lVar13 + iVar16 >> auVar19;
    *(int *)((long)out[2] + 0xc) = iVar6 + iVar16 >> auVar19;
    *(int *)out[3] = iVar16 + (int)lVar14 >> auVar19;
    *(int *)((long)out[3] + 4) = iVar16 + iVar7 >> auVar19;
    *(int *)(out[3] + 1) = iVar16 + (int)lVar15 >> auVar19;
    *(int *)((long)out[3] + 0xc) = iVar16 + iVar8 >> auVar19;
  }
  iStack_24 = local_28;
  iStack_20 = local_28;
  iStack_1c = local_28;
  iStack_14 = local_18;
  iStack_10 = local_18;
  iStack_c = local_18;
  highbd_clamp_epi32_sse4_1(out,out,(__m128i *)&local_18,(__m128i *)&local_28,4);
  return;
}

Assistant:

static void iidentity4_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                              int bd, int out_shift) {
  (void)bit;
  __m128i zero = _mm_setzero_si128();
  __m128i fact = _mm_set1_epi32(NewSqrt2);
  __m128i offset = _mm_set1_epi32(1 << (NewSqrt2Bits - 1));
  __m128i a0_low, a1_low;
  __m128i a0_high, a1_high;

  offset = _mm_unpacklo_epi32(offset, zero);

  for (int i = 0; i < 4; i++) {
    a0_low = _mm_mul_epi32(in[i], fact);
    a0_low = _mm_add_epi32(a0_low, offset);
    a0_low = _mm_srli_epi64(a0_low, NewSqrt2Bits);

    a0_high = _mm_srli_si128(in[i], 4);
    a0_high = _mm_mul_epi32(a0_high, fact);
    a0_high = _mm_add_epi32(a0_high, offset);
    a0_high = _mm_srli_epi64(a0_high, NewSqrt2Bits);

    a1_low = _mm_unpacklo_epi32(a0_low, a0_high);
    a1_high = _mm_unpackhi_epi32(a0_low, a0_high);
    out[i] = _mm_unpacklo_epi64(a1_low, a1_high);
  }

  if (!do_cols) {
    const int log_range = AOMMAX(16, bd + 6);
    const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
    const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
    round_shift_4x4(out, out_shift);
    highbd_clamp_epi32_sse4_1(out, out, &clamp_lo, &clamp_hi, 4);
  }
}